

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalHashAggregate::SinkDistinctGrouping
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input,idx_t grouping_idx)

{
  LocalSinkState *pLVar1;
  pointer puVar2;
  size_type __n;
  reference pvVar3;
  reference pvVar4;
  type pDVar5;
  const_reference pvVar6;
  pointer __k;
  const_reference pvVar7;
  pointer pEVar8;
  BoundAggregateExpression *pBVar9;
  mapped_type *pmVar10;
  pointer pDVar11;
  reference pvVar12;
  type this_00;
  pointer pDVar13;
  reference this_01;
  type pGVar14;
  reference this_02;
  type pLVar15;
  AggregateFilterData *this_03;
  const_iterator cVar16;
  BoundReferenceExpression *pBVar17;
  reference pvVar18;
  reference pvVar19;
  idx_t count;
  reference this_04;
  idx_t group_idx;
  ulong uVar20;
  SelectionVector sel_vec;
  unsafe_vector<idx_t> empty_filter;
  OperatorSinkInput sink_input;
  DataChunk filtered_input;
  DataChunk filter_chunk;
  DataChunk empty_chunk;
  InterruptState interrupt_state;
  SelectionVector local_180;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  OperatorSinkInput local_148;
  DataChunk local_130;
  DataChunk local_f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b0;
  DataChunk local_98;
  InterruptState local_58;
  
  pLVar1 = input->local_state;
  pvVar3 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                     ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)
                      (input->global_state + 1),grouping_idx);
  pvVar4 = vector<duckdb::HashAggregateGroupingLocalState,_true>::get<true>
                     ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                      &pLVar1[2].partition_info.min_batch_index,grouping_idx);
  pDVar5 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
           ::operator*(&this->distinct_collection_info);
  pvVar6 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&this->groupings,grouping_idx)
  ;
  DataChunk::DataChunk(&local_98);
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (pDVar5->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__k = (pDVar5->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start; __k != puVar2; __k = __k + 1) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&(this->grouped_aggregate_data).aggregates,*__k);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pBVar9 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar8->super_BaseExpression);
    pmVar10 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&pDVar5->table_map,__k);
    __n = *pmVar10;
    pDVar11 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
              ::operator->(&pvVar6->distinct_data);
    pvVar12 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
              ::get<true>(&pDVar11->radix_tables,__n);
    if ((pvVar12->
        super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
        .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
        (RadixPartitionedHashTable *)0x0) {
      pDVar11 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                ::operator->(&pvVar6->distinct_data);
      pvVar12 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::get<true>(&pDVar11->radix_tables,__n);
      this_00 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                ::operator*(pvVar12);
      pDVar13 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                ::operator->(&pvVar3->distinct_state);
      this_01 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                ::get<true>(&pDVar13->radix_states,__n);
      pGVar14 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                ::operator*(this_01);
      this_02 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                ::get<true>(&pvVar4->distinct_states,__n);
      pLVar15 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                ::operator*(this_02);
      InterruptState::InterruptState(&local_58);
      local_148.global_state = pGVar14;
      local_148.local_state = pLVar15;
      local_148.interrupt_state = &local_58;
      if ((pBVar9->filter).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0) {
        RadixPartitionedHashTable::Sink
                  (this_00,context,chunk,&local_148,&local_98,(unsafe_vector<idx_t> *)&local_168);
      }
      else {
        DataChunk::DataChunk(&local_f0);
        this_03 = AggregateFilterDataSet::GetFilterData
                            ((AggregateFilterDataSet *)
                             &pLVar1[2].partition_info.partition_data.
                              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                              .
                              super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,*__k);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_130,
                            &this_03->filtered_payload);
        DataChunk::InitializeEmpty(&local_f0,(vector<duckdb::LogicalType,_true> *)&local_130);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_130);
        local_130.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pBVar9->filter).
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                      .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        cVar16 = ::std::
                 _Hashtable<duckdb::Expression_*,_std::pair<duckdb::Expression_*const,_unsigned_long>,_std::allocator<std::pair<duckdb::Expression_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Expression_*>,_std::hash<duckdb::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->filter_indexes)._M_h,(key_type *)&local_130);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar9->filter);
        pBVar17 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                            (&pEVar8->super_BaseExpression);
        pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_f0.data,pBVar17->index);
        pvVar19 = vector<duckdb::Vector,_true>::get<true>
                            (&chunk->data,
                             *(size_type *)
                              ((long)cVar16.
                                     super__Node_iterator_base<std::pair<duckdb::Expression_*const,_unsigned_long>,_false>
                                     ._M_cur + 0x10));
        Vector::Reference(pvVar18,pvVar19);
        local_f0.count = chunk->count;
        SelectionVector::SelectionVector(&local_180,0x800);
        count = ExpressionExecutor::SelectExpression(&this_03->filter_executor,&local_f0,&local_180)
        ;
        if (count != 0) {
          DataChunk::DataChunk(&local_130);
          DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_b0,chunk);
          DataChunk::InitializeEmpty(&local_130,(vector<duckdb::LogicalType,_true> *)&local_b0);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_b0);
          for (uVar20 = 0;
              uVar20 < (ulong)((long)(this->grouped_aggregate_data).groups.
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->grouped_aggregate_data).groups.
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar20 = uVar20 + 1) {
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(&(this->grouped_aggregate_data).groups,uVar20);
            pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar7);
            pBVar17 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                (&pEVar8->super_BaseExpression);
            pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_130.data,pBVar17->index);
            pvVar19 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,pBVar17->index);
            Vector::Reference(pvVar18,pvVar19);
            Vector::Slice(pvVar18,&local_180,count);
          }
          for (uVar20 = 0;
              uVar20 < (ulong)((long)(pBVar9->children).
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pBVar9->children).
                                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar20 = uVar20 + 1) {
            this_04 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::get<true>(&pBVar9->children,uVar20);
            pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_04);
            pBVar17 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                                (&pEVar8->super_BaseExpression);
            pvVar18 = vector<duckdb::Vector,_true>::get<true>(&local_130.data,pBVar17->index);
            pvVar19 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,pBVar17->index);
            Vector::Reference(pvVar18,pvVar19);
            Vector::Slice(pvVar18,&local_180,count);
          }
          local_130.count = count;
          RadixPartitionedHashTable::Sink
                    (this_00,context,&local_130,&local_148,&local_98,
                     (unsafe_vector<idx_t> *)&local_168);
          DataChunk::~DataChunk(&local_130);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_180.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        DataChunk::~DataChunk(&local_f0);
      }
      InterruptState::~InterruptState(&local_58);
    }
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_168);
  DataChunk::~DataChunk(&local_98);
  return;
}

Assistant:

void PhysicalHashAggregate::SinkDistinctGrouping(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input,
                                                 idx_t grouping_idx) const {
	auto &sink = input.local_state.Cast<HashAggregateLocalSinkState>();
	auto &global_sink = input.global_state.Cast<HashAggregateGlobalSinkState>();

	auto &grouping_gstate = global_sink.grouping_states[grouping_idx];
	auto &grouping_lstate = sink.grouping_states[grouping_idx];
	auto &distinct_info = *distinct_collection_info;

	auto &distinct_state = grouping_gstate.distinct_state;
	auto &distinct_data = groupings[grouping_idx].distinct_data;

	DataChunk empty_chunk;

	// Create an empty filter for Sink, since we don't need to update any aggregate states here
	unsafe_vector<idx_t> empty_filter;

	for (idx_t &idx : distinct_info.indices) {
		auto &aggregate = grouped_aggregate_data.aggregates[idx]->Cast<BoundAggregateExpression>();

		D_ASSERT(distinct_info.table_map.count(idx));
		idx_t table_idx = distinct_info.table_map[idx];
		if (!distinct_data->radix_tables[table_idx]) {
			continue;
		}
		D_ASSERT(distinct_data->radix_tables[table_idx]);
		auto &radix_table = *distinct_data->radix_tables[table_idx];
		auto &radix_global_sink = *distinct_state->radix_states[table_idx];
		auto &radix_local_sink = *grouping_lstate.distinct_states[table_idx];

		InterruptState interrupt_state;
		OperatorSinkInput sink_input {radix_global_sink, radix_local_sink, interrupt_state};

		if (aggregate.filter) {
			DataChunk filter_chunk;
			auto &filtered_data = sink.filter_set.GetFilterData(idx);
			filter_chunk.InitializeEmpty(filtered_data.filtered_payload.GetTypes());

			// Add the filter Vector (BOOL)
			auto it = filter_indexes.find(aggregate.filter.get());
			D_ASSERT(it != filter_indexes.end());
			D_ASSERT(it->second < chunk.data.size());
			auto &filter_bound_ref = aggregate.filter->Cast<BoundReferenceExpression>();
			filter_chunk.data[filter_bound_ref.index].Reference(chunk.data[it->second]);
			filter_chunk.SetCardinality(chunk.size());

			// We cant use the AggregateFilterData::ApplyFilter method, because the chunk we need to
			// apply the filter to also has the groups, and the filtered_data.filtered_payload does not have those.
			SelectionVector sel_vec(STANDARD_VECTOR_SIZE);
			idx_t count = filtered_data.filter_executor.SelectExpression(filter_chunk, sel_vec);

			if (count == 0) {
				continue;
			}

			// Because the 'input' chunk needs to be re-used after this, we need to create
			// a duplicate of it, that we can apply the filter to
			DataChunk filtered_input;
			filtered_input.InitializeEmpty(chunk.GetTypes());

			for (idx_t group_idx = 0; group_idx < grouped_aggregate_data.groups.size(); group_idx++) {
				auto &group = grouped_aggregate_data.groups[group_idx];
				auto &bound_ref = group->Cast<BoundReferenceExpression>();
				auto &col = filtered_input.data[bound_ref.index];
				col.Reference(chunk.data[bound_ref.index]);
				col.Slice(sel_vec, count);
			}
			for (idx_t child_idx = 0; child_idx < aggregate.children.size(); child_idx++) {
				auto &child = aggregate.children[child_idx];
				auto &bound_ref = child->Cast<BoundReferenceExpression>();
				auto &col = filtered_input.data[bound_ref.index];
				col.Reference(chunk.data[bound_ref.index]);
				col.Slice(sel_vec, count);
			}
			filtered_input.SetCardinality(count);

			radix_table.Sink(context, filtered_input, sink_input, empty_chunk, empty_filter);
		} else {
			radix_table.Sink(context, chunk, sink_input, empty_chunk, empty_filter);
		}
	}
}